

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void emulator_step_internal(Emulator *e)

{
  Bool BVar1;
  Emulator *e_local;
  
  if ((e->state).hdma.state == DMA_INACTIVE) {
    BVar1 = HOOK_emulator_step(e,"emulator_step_internal");
    if (BVar1 == FALSE) {
      execute_instruction(e);
    }
  }
  else {
    tick(e);
    hdma_copy_byte(e);
    hdma_copy_byte(e);
  }
  return;
}

Assistant:

static void emulator_step_internal(Emulator* e) {
  if (HDMA.state == DMA_INACTIVE) {
    if (HOOK0_FALSE(emulator_step)) {
      return;
    }
    execute_instruction(e);
#ifdef RGBDS_LIVE
    if (e->breakpoint[REG.PC]) {
      e->state.event |= EMULATOR_EVENT_BREAKPOINT;
    }
#endif
  } else {
    tick(e);
    hdma_copy_byte(e);
    hdma_copy_byte(e);
  }
}